

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::QGraphicsAnchorLayoutPrivate(QGraphicsAnchorLayoutPrivate *this)

{
  QHVContainer<QList<QtGraphicsAnchorLayout::AnchorData_*>_> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsLayoutPrivate *in_stack_ffffffffffffff80;
  QLayoutStyleInfo *this_00;
  QHVContainer<QList<QtGraphicsAnchorLayout::AnchorData_*>_> *this_01;
  QLayoutStyleInfo *local_68;
  QLayoutStyleInfo *local_60;
  double local_58;
  double local_50;
  array<double,_3UL> local_48;
  array<double,_3UL> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  QGraphicsLayoutPrivate::QGraphicsLayoutPrivate(in_stack_ffffffffffffff80);
  in_RDI->m_data[0].d.d = (Data *)&PTR__QGraphicsAnchorLayoutPrivate_00d32098;
  this_00 = (QLayoutStyleInfo *)0xbff0000000000000;
  local_50 = -1.0;
  local_58 = -1.0;
  QHVContainer<double>::QHVContainer
            ((QHVContainer<double> *)&in_RDI[5].m_data[1].d.ptr,&local_50,&local_58);
  local_28._M_elems[0] = -1.0;
  local_28._M_elems[1] = -1.0;
  local_48._M_elems[0] = -1.0;
  local_48._M_elems[1] = -1.0;
  local_48._M_elems[2] = (double)this_00;
  local_28._M_elems[2] = (double)this_00;
  QHVContainer<std::array<double,_3UL>_>::QHVContainer
            ((QHVContainer<std::array<double,_3UL>_> *)(in_RDI + 6),&local_28,&local_48);
  QList<QGraphicsLayoutItem_*>::QList((QList<QGraphicsLayoutItem_*> *)0x93a051);
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  ::QHash((QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
           *)(in_RDI[7].m_data + 1));
  QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>::
  QHVContainer((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                *)this_01);
  in_RDI[8].m_data[0].d.d = (Data *)0x0;
  in_RDI[8].m_data[0].d.ptr = (AnchorData **)0x0;
  in_RDI[8].m_data[0].d.size = 0;
  in_RDI[8].m_data[1].d.d = (Data *)0x0;
  in_RDI[8].m_data[1].d.ptr = (AnchorData **)0x0;
  in_RDI[8].m_data[1].d.size = 0;
  QHVContainer<QList<QtGraphicsAnchorLayout::AnchorVertexPair_*>_>::QHVContainer
            ((QHVContainer<QList<QtGraphicsAnchorLayout::AnchorVertexPair_*>_> *)this_01);
  QHVContainer<QList<QtGraphicsAnchorLayout::AnchorData_*>_>::QHVContainer(this_01);
  QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
  ::QHVContainer((QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                  *)this_01);
  QHVContainer<QList<QSimplexConstraint_*>_>::QHVContainer
            ((QHVContainer<QList<QSimplexConstraint_*>_> *)this_01);
  QHVContainer<QList<QSimplexConstraint_*>_>::QHVContainer
            ((QHVContainer<QList<QSimplexConstraint_*>_> *)this_01);
  local_68 = this_00;
  local_60 = this_00;
  QHVContainer<double>::QHVContainer
            ((QHVContainer<double> *)&in_RDI[0xd].m_data[1].d.size,(double *)&local_60,
             (double *)&local_68);
  *(undefined2 *)&in_RDI[0xe].m_data[0].d.ptr = 0;
  QHVContainer<QSet<QGraphicsLayoutItem_*>_>::QHVContainer
            ((QHVContainer<QSet<QGraphicsLayoutItem_*>_> *)this_01);
  *(byte *)&in_RDI[0xe].m_data[1].d.ptr = *(byte *)&in_RDI[0xe].m_data[1].d.ptr | 1;
  *(byte *)&in_RDI[0xe].m_data[1].d.ptr = *(byte *)&in_RDI[0xe].m_data[1].d.ptr | 2;
  QLayoutStyleInfo::QLayoutStyleInfo(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsAnchorLayoutPrivate::QGraphicsAnchorLayoutPrivate()
    : calculateGraphCacheDirty(true), styleInfoDirty(true)
{
}